

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_1.h
# Opt level: O2

void __thiscall
dlib::
queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::swap(queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
       *this,queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             *item)

{
  bool bVar1;
  node *pnVar2;
  node *pnVar3;
  unsigned_long uVar4;
  node *pnVar5;
  node *pnVar6;
  node *pnVar7;
  
  pnVar2 = this->in;
  pnVar3 = this->out;
  uVar4 = this->queue_size;
  pnVar5 = this->current_element;
  bVar1 = this->at_start_;
  pnVar6 = item->in;
  pnVar7 = item->out;
  this->queue_size = item->queue_size;
  this->at_start_ = item->at_start_;
  this->in = pnVar6;
  this->out = pnVar7;
  this->current_element = item->current_element;
  item->in = pnVar2;
  item->out = pnVar3;
  item->queue_size = uVar4;
  item->current_element = pnVar5;
  item->at_start_ = bVar1;
  return;
}

Assistant:

void queue_kernel_1<T,mem_manager>::
    swap (
        queue_kernel_1<T,mem_manager>& item
    )
    {
        node* in_temp = in;
        node* out_temp = out;
        unsigned long queue_size_temp = queue_size;
        node* current_element_temp = current_element;
        bool at_start_temp = at_start_;

        in = item.in;
        out = item.out;
        queue_size = item.queue_size;
        current_element = item.current_element;
        at_start_ = item.at_start_;

        item.in = in_temp;
        item.out = out_temp;
        item.queue_size = queue_size_temp;
        item.current_element = current_element_temp;
        item.at_start_ = at_start_temp;
    }